

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fClippingTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::anon_unknown_0::TriangleCaseBase::TriangleCaseBase
          (TriangleCaseBase *this,Context *context,char *name,char *description,
          TriangleData *polysBegin,TriangleData *polysEnd,WindowRectangle *viewport)

{
  TriangleData *v;
  pointer this_00;
  int iVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  pointer pTVar5;
  long lVar6;
  
  RenderTestCase::RenderTestCase(&this->super_RenderTestCase,context,name,description);
  (this->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TriangleCaseBase_01e40cc8;
  (this->m_polys).
  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_polys).
  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_polys).
  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar4 = ((long)polysEnd - (long)polysBegin) / 0x60;
  if (uVar4 < 0x155555555555556) {
    if (polysEnd == polysBegin) {
      pTVar5 = (pointer)0x0;
    }
    else {
      pTVar5 = (pointer)operator_new((long)polysEnd - (long)polysBegin);
    }
    (this->m_polys).
    super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData>_>
    ._M_impl.super__Vector_impl_data._M_start = pTVar5;
    (this->m_polys).
    super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = pTVar5 + uVar4;
    lVar6 = 0;
    while( true ) {
      v = (TriangleData *)((long)(polysBegin->p0).m_data + lVar6);
      this_00 = (pointer)((long)(pTVar5->p0).m_data + lVar6);
      if (v == polysEnd) break;
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)this_00,(Vector<float,_4> *)v);
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)((long)(pTVar5->c0).m_data + lVar6),&v->c0);
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)((long)(pTVar5->p1).m_data + lVar6),&v->p1);
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)((long)(pTVar5->c1).m_data + lVar6),&v->c1);
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)((long)(pTVar5->p2).m_data + lVar6),&v->p2);
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)((long)(pTVar5->c2).m_data + lVar6),&v->c2);
      lVar6 = lVar6 + 0x60;
    }
    (this->m_polys).
    super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::TriangleCaseBase::TriangleData>_>
    ._M_impl.super__Vector_impl_data._M_finish = this_00;
    iVar1 = viewport->bottom;
    iVar2 = viewport->width;
    iVar3 = viewport->height;
    (this->m_viewport).left = viewport->left;
    (this->m_viewport).bottom = iVar1;
    (this->m_viewport).width = iVar2;
    (this->m_viewport).height = iVar3;
    return;
  }
  std::__throw_length_error("cannot create std::vector larger than max_size()");
}

Assistant:

TriangleCaseBase::TriangleCaseBase (Context& context, const char* name, const char* description, const TriangleData* polysBegin, const TriangleData* polysEnd, const rr::WindowRectangle& viewport)
	: RenderTestCase(context, name, description)
	, m_polys		(polysBegin, polysEnd)
	, m_viewport	(viewport)
{
}